

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O0

void __thiscall EefcFlash::waitFSR(EefcFlash *this,int seconds)

{
  uint32_t uVar1;
  FlashCmdError *pFVar2;
  FlashLockError *pFVar3;
  FlashTimeoutError *this_00;
  uint local_20;
  uint32_t fsr1;
  uint32_t fsr0;
  int tries;
  int seconds_local;
  EefcFlash *this_local;
  
  local_20 = 1;
  fsr1 = seconds * 1000;
  while (0 < (int)fsr1) {
    uVar1 = Samba::readWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 8);
    if ((uVar1 & 2) != 0) {
      pFVar2 = (FlashCmdError *)__cxa_allocate_exception(8);
      FlashCmdError::FlashCmdError(pFVar2);
      __cxa_throw(pFVar2,&FlashCmdError::typeinfo,FlashCmdError::~FlashCmdError);
    }
    if ((uVar1 & 4) != 0) {
      pFVar3 = (FlashLockError *)__cxa_allocate_exception(8);
      FlashLockError::FlashLockError(pFVar3);
      __cxa_throw(pFVar3,&FlashLockError::typeinfo,FlashLockError::~FlashLockError);
    }
    if ((this->super_Flash)._planes == 2) {
      local_20 = Samba::readWord((this->super_Flash)._samba,
                                 *(int *)&(this->super_Flash).field_0xf4 + 0x208);
      if ((local_20 & 2) != 0) {
        pFVar2 = (FlashCmdError *)__cxa_allocate_exception(8);
        FlashCmdError::FlashCmdError(pFVar2);
        __cxa_throw(pFVar2,&FlashCmdError::typeinfo,FlashCmdError::~FlashCmdError);
      }
      if ((local_20 & 4) != 0) {
        pFVar3 = (FlashLockError *)__cxa_allocate_exception(8);
        FlashLockError::FlashLockError(pFVar3);
        __cxa_throw(pFVar3,&FlashLockError::typeinfo,FlashLockError::~FlashLockError);
      }
    }
    if ((uVar1 & local_20 & 1) != 0) break;
    usleep(1000);
    fsr1 = fsr1 - 1;
  }
  if (fsr1 - 1 != 0) {
    return;
  }
  this_00 = (FlashTimeoutError *)__cxa_allocate_exception(8);
  FlashTimeoutError::FlashTimeoutError(this_00);
  __cxa_throw(this_00,&FlashTimeoutError::typeinfo,FlashTimeoutError::~FlashTimeoutError);
}

Assistant:

void
EefcFlash::waitFSR(int seconds)
{
    int tries = seconds * 1000;
    uint32_t fsr0;
    uint32_t fsr1 = 0x1;

    while (tries-- > 0)
    {
        fsr0 = _samba.readWord(EEFC0_FSR);
        if (fsr0 & 0x2)
            throw FlashCmdError();
        if (fsr0 & 0x4)
            throw FlashLockError();

        if (_planes == 2)
        {
            fsr1 = _samba.readWord(EEFC1_FSR);
            if (fsr1 & 0x2)
                throw FlashCmdError();
            if (fsr1 & 0x4)
                throw FlashLockError();
        }
        if (fsr0 & fsr1 & 0x1)
            break;
        usleep(1000);
    }
    if (tries == 0)
        throw FlashTimeoutError();
}